

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blitter.hpp
# Opt level: O0

string * __thiscall
Amiga::Blitter<true>::Transaction::to_string_abi_cxx11_
          (string *__return_storage_ptr__,Transaction *this)

{
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_19;
  Transaction *local_18;
  Transaction *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Transaction *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch(this->type) {
  case SkippedSlot:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SkippedSlot");
    break;
  case ReadA:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"ReadA");
    break;
  case ReadB:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"ReadB");
    break;
  case ReadC:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"ReadC");
    break;
  case AddToPipeline:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"AddToPipeline");
    break;
  case WriteFromPipeline:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"WriteFromPipeline");
  }
  std::__cxx11::to_string(&local_b0,this->address);
  std::operator+(&local_90," address:",&local_b0);
  std::operator+(&local_70,&local_90," value:");
  std::__cxx11::to_string(&local_d0,(uint)this->value);
  std::operator+(&local_50,&local_70,&local_d0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const {
				std::string result;

				switch(type) {
					case Type::SkippedSlot:			result = "SkippedSlot";			break;
					case Type::ReadA:				result = "ReadA";				break;
					case Type::ReadB:				result = "ReadB";				break;
					case Type::ReadC:				result = "ReadC";				break;
					case Type::AddToPipeline:		result = "AddToPipeline";		break;
					case Type::WriteFromPipeline:	result = "WriteFromPipeline";	break;
				}

				result += " address:" + std::to_string(address) + " value:" + std::to_string(value);
				return result;
			}